

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

void Gia_ManCheckUnateVecTest(Gia_Man_t *p,int fVerbose)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Vec_Wec_t *p_00;
  void *__ptr;
  Vec_Int_t *p_01;
  abctime aVar9;
  Vec_Int_t *vUnate;
  char *pBuffer;
  int nNonUnate;
  int nUnate;
  int nVars;
  int Var;
  int o;
  int i;
  Vec_Wec_t *vUnates;
  abctime clk;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  aVar8 = Abc_Clock();
  p_00 = Gia_ManCheckUnateVec(p,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  iVar2 = Gia_ManCiNum(p);
  pBuffer._4_4_ = 0;
  pBuffer._0_4_ = 0;
  __ptr = calloc((long)(iVar2 + 1),1);
  if (fVerbose != 0) {
    printf("Inputs  : ");
    for (Var = 0; Var < iVar2; Var = Var + 1) {
      printf("%d",(long)Var % 10 & 0xffffffff);
    }
    printf("\n");
  }
  nVars = 0;
  do {
    iVar3 = Gia_ManCoNum(p);
    if (iVar3 <= nVars) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar6 = Gia_ManCiNum(p);
      uVar7 = Gia_ManCoNum(p);
      printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",(ulong)uVar6,
             (ulong)uVar7,(ulong)(pBuffer._4_4_ + (int)pBuffer),(ulong)pBuffer._4_4_);
      Abc_Print(1,"%s =","Total time");
      aVar9 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar8) * 1.0) / 1000000.0);
      Vec_WecFree(p_00);
      return;
    }
    p_01 = Vec_WecEntry(p_00,nVars);
    memset(__ptr,0x20,(long)iVar2);
    for (Var = 0; iVar3 = Vec_IntSize(p_01), Var < iVar3; Var = Var + 1) {
      iVar3 = Vec_IntEntry(p_01,Var);
      iVar4 = Vec_IntSize(p_01);
      if (Var + 1 < iVar4) {
        iVar4 = Abc_Lit2Var(iVar3);
        iVar5 = Vec_IntEntry(p_01,Var + 1);
        iVar5 = Abc_Lit2Var(iVar5);
        if (iVar4 != iVar5) goto LAB_00a2ccf6;
        iVar3 = Abc_Lit2Var(iVar3);
        *(undefined1 *)((long)__ptr + (long)iVar3) = 0x2e;
        Var = Var + 1;
        pBuffer._0_4_ = (int)pBuffer + 1;
      }
      else {
LAB_00a2ccf6:
        iVar4 = Abc_LitIsCompl(iVar3);
        uVar1 = 0x70;
        if (iVar4 != 0) {
          uVar1 = 0x6e;
        }
        iVar3 = Abc_Lit2Var(iVar3);
        *(undefined1 *)((long)__ptr + (long)iVar3) = uVar1;
        pBuffer._4_4_ = pBuffer._4_4_ + 1;
      }
    }
    if (fVerbose != 0) {
      printf("Out%4d : %s\n",(ulong)(uint)nVars,__ptr);
    }
    nVars = nVars + 1;
  } while( true );
}

Assistant:

void Gia_ManCheckUnateVecTest( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vUnates = Gia_ManCheckUnateVec( p, NULL, NULL );
    int i, o, Var, nVars = Gia_ManCiNum(p);
    int nUnate = 0, nNonUnate = 0;
    char * pBuffer = ABC_CALLOC( char, nVars+1 );
    if ( fVerbose )
    {
        printf( "Inputs  : " );
        for ( i = 0; i < nVars; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    for ( o = 0; o < Gia_ManCoNum(p); o++ )
    {
        Vec_Int_t * vUnate = Vec_WecEntry( vUnates, o );
        memset( pBuffer, ' ', (size_t)nVars );
        Vec_IntForEachEntry( vUnate, Var, i )
            if ( i+1 < Vec_IntSize(vUnate) && Abc_Lit2Var(Var) == Abc_Lit2Var(Vec_IntEntry(vUnate, i+1)) ) // both lits are present
                pBuffer[Abc_Lit2Var(Var)] = '.', i++, nNonUnate++; // does not depend on this var
            else
                pBuffer[Abc_Lit2Var(Var)] = Abc_LitIsCompl(Var) ? 'n' : 'p', nUnate++;
        if ( fVerbose )
            printf( "Out%4d : %s\n", o, pBuffer );
    }
    ABC_FREE( pBuffer );
    // print stats
    printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
        Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
    ABC_PRT( "Total time", Abc_Clock() - clk );
    //Vec_WecPrint( vUnates, 0 );
    Vec_WecFree( vUnates );
}